

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O2

char * __thiscall
Database::query(Database *this,char mktsegmentCondition,uint16_t orderdateCondition,
               uint16_t shipdateCondition,uint16_t topn)

{
  uint16_t orderdate;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  uint32_t extendedpricesum;
  uint32_t pos;
  uint uVar5;
  MaxHeap heap;
  
  iVar2 = util::get_key_index(mktsegmentCondition);
  uVar1 = *this->a_orderkey[iVar2];
  MaxHeap::MaxHeap(&heap,topn);
  for (uVar5 = 1; uVar5 <= uVar1; uVar5 = uVar5 + 1) {
    if (this->a_extendedpricesum[iVar2][uVar5] <= *heap.c3Result) break;
    orderdate = this->a_orderdate[iVar2][uVar5];
    if (orderdate < orderdateCondition) {
      if (shipdateCondition < this->a_minshipdate[iVar2][uVar5]) {
        MaxHeap::insert(&heap,this->a_orderkey[iVar2][uVar5],orderdate,
                        this->a_extendedpricesum[iVar2][uVar5]);
      }
      else if (shipdateCondition < this->a_maxshipdate[iVar2][uVar5]) {
        extendedpricesum = 0;
        for (uVar3 = (ulong)this->a_lineitemposition[iVar2][uVar5];
            (uVar3 >> 1 < 0x59686629 && (this->l_orderkey[uVar3] == this->a_orderkey[iVar2][uVar5]))
            ; uVar3 = uVar3 + 1) {
          if (shipdateCondition < this->l_shipdate[uVar3]) {
            extendedpricesum = extendedpricesum + this->l_extendedprice[uVar3];
          }
        }
        MaxHeap::insert(&heap,this->a_orderkey[iVar2][uVar5],orderdate,extendedpricesum);
      }
    }
  }
  pcVar4 = MaxHeap::getResults(&heap);
  MaxHeap::~MaxHeap(&heap);
  return pcVar4;
}

Assistant:

inline char* query(char mktsegmentCondition, uint16_t orderdateCondition, uint16_t shipdateCondition, uint16_t topn) {
    auto p = util::get_key_index(mktsegmentCondition);
    auto A_LENGTH = a_orderkey[p][0];
    MaxHeap heap(topn);
    for (uint32_t pos = 1; pos <= A_LENGTH; ++pos) {
      if (a_extendedpricesum[p][pos] <= heap.top()) {  // early stop
        break;
      }
      if (a_orderdate[p][pos] < orderdateCondition) {
        if (a_minshipdate[p][pos] > shipdateCondition) {
          heap.insert(a_orderkey[p][pos], a_orderdate[p][pos], a_extendedpricesum[p][pos]);
        } else if (a_maxshipdate[p][pos] > shipdateCondition) { // lookup lineitem table
          uint32_t l_position = a_lineitemposition[p][pos];
          uint32_t joinkey = a_orderkey[p][pos];
          uint32_t eps = 0;
          while (l_position < LINEITEM && l_orderkey[l_position] == joinkey) {
            if (l_shipdate[l_position] > shipdateCondition) {
              eps += l_extendedprice[l_position];
            }
            ++l_position;
          }
          heap.insert(a_orderkey[p][pos], a_orderdate[p][pos], eps);
        }
      }
    }
    return heap.getResults();
  }